

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O3

NodeResult __thiscall HighsSearch::branch(HighsSearch *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  HighsLpRelaxation *pHVar5;
  HighsPseudocost *pHVar6;
  pointer ppVar7;
  pointer pdVar8;
  pointer pHVar9;
  pointer pHVar10;
  int *piVar11;
  double dVar12;
  bool bVar13;
  HighsInt HVar14;
  NodeResult NVar15;
  HighsBoundType HVar16;
  long lVar17;
  HighsMipSolver *pHVar18;
  vector<double,_std::allocator<double>_> *pvVar19;
  HighsLpRelaxation *pHVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  HighsMipSolver *pHVar24;
  HighsLpRelaxation *pHVar25;
  pointer pdVar26;
  pointer __args;
  HighsLpRelaxation *__tmp;
  double *pdVar27;
  int *piVar28;
  pointer pNVar29;
  int64_t maxSbIters;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 extraout_XMM0_Dc;
  HighsBoundType extraout_XMM0_Dd;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double frac;
  HighsMipSolver *pHVar35;
  double upNodeLb;
  double downNodeLb;
  undefined1 local_5460 [16];
  undefined8 uStack_5450;
  undefined1 local_5448 [32];
  HighsMipSolver *local_5428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5420;
  HighsDomainChange local_5418;
  pointer local_5400;
  pointer local_53f8;
  double *local_53f0;
  HighsLpRelaxation local_53e8;
  
  pNVar29 = (this->nodestack).
            super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pNVar29[-1].branchingdecision.column = -1;
  this->inbranching = true;
  iVar4 = this->pseudocost->minreliable;
  local_5460._0_8_ = pNVar29[-1].lower_bound;
  uStack_5450 = (double)local_5460._8_8_;
  NVar15 = kOpen;
  local_5460._8_8_ = local_5460._0_8_;
  if (pNVar29[-1].opensubtrees == '\x02') {
    local_5428 = (HighsMipSolver *)(double)iVar4;
    local_5418.boundval = (double)(iVar4 + -1);
    pHVar20 = &local_53e8;
    pHVar25 = (HighsLpRelaxation *)local_5448;
    do {
      pHVar5 = this->lp;
      if (((2 < pHVar5->status - kUnscaledDualFeasible) && (pHVar5->status != kOptimal)) ||
         ((pHVar5->fractionalints).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pHVar5->fractionalints).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish)) break;
      if (iVar4 < 1) {
        maxSbIters = 0;
      }
      else {
        _Var30._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar17 = (_Var30._M_head_impl)->sb_lp_iterations + this->sblpiterations;
        maxSbIters = ((this->lpiterations + (_Var30._M_head_impl)->total_lp_iterations) -
                      (this->heurlpiterations + lVar17 +
                      (_Var30._M_head_impl)->heuristic_lp_iterations) >> 1) + 100000;
        iVar21 = 0;
        if (lVar17 <= maxSbIters) {
          lVar22 = maxSbIters >> 1;
          if (lVar17 - lVar22 == 0 || lVar17 < lVar22) goto LAB_002e3572;
          iVar21 = (int)((double)local_5428 -
                        ((double)(lVar17 - lVar22) / (double)(maxSbIters - lVar22)) *
                        local_5418.boundval);
          if (iVar4 < iVar21) {
            iVar21 = iVar4;
          }
        }
        this->pseudocost->minreliable = iVar21;
      }
LAB_002e3572:
      dVar12 = HighsLpRelaxation::computeLPDegneracy(pHVar5,&this->localdom);
      pHVar6 = this->pseudocost;
      pHVar6->degeneracyFactor = dVar12;
      if (10.0 <= dVar12) {
        pHVar6->minreliable = 0;
      }
      local_5448._0_8_ =
           (this->nodestack).
           super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl
           .super__Vector_impl_data._M_finish[-1].lower_bound;
      local_53e8.mipsolver = (HighsMipSolver *)local_5448._0_8_;
      HVar14 = selectBranchingCandidate(this,maxSbIters,(double *)pHVar20,(double *)pHVar25);
      pNVar29 = (this->nodestack).
                super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_5460._0_8_ = pNVar29[-1].lower_bound;
      local_5460._8_8_ = local_5460._0_8_;
      if (HVar14 != -1) {
        pHVar5 = this->lp;
        ppVar7 = (pHVar5->fractionalints).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar21 = ppVar7[HVar14].first;
        pdVar26 = (pointer)(long)iVar21;
        pHVar18 = (HighsMipSolver *)ppVar7[HVar14].second;
        uVar31 = SUB84(pHVar18,0);
        uVar32 = (undefined4)((ulong)pHVar18 >> 0x20);
        pNVar29[-1].branchingdecision.column = iVar21;
        pNVar29[-1].branching_point = (double)pHVar18;
        NVar15 = kBranched;
        switch(this->childselrule) {
        case kUp:
          break;
        case kDown:
switchD_002e365e_caseD_1:
          pNVar29[-1].branchingdecision.boundtype = kUpper;
LAB_002e39fa:
          dVar12 = floor((double)CONCAT44(uVar32,uVar31));
          uVar31 = SUB84(dVar12,0);
          uVar32 = (undefined4)((ulong)dVar12 >> 0x20);
LAB_002e39ff:
          pNVar29[-1].branchingdecision.boundval = (double)CONCAT44(uVar32,uVar31);
          pNVar29[-1].other_child_lb = (double)local_5448._0_8_;
          uVar31 = SUB84(local_53e8.mipsolver,0);
          uVar32 = (undefined4)((ulong)local_53e8.mipsolver >> 0x20);
          goto LAB_002e3a68;
        case kRootSol:
          _Var30._M_head_impl =
               (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          dVar12 = (_Var30._M_head_impl)->epsilon +
                   (this->pseudocost->inferencesup).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pdVar26];
          uStack_5450._0_4_ = SUB84(dVar12,0);
          local_5460._8_8_ =
               (_Var30._M_head_impl)->epsilon +
               (this->pseudocost->inferencesdown).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)pdVar26];
          uStack_5450._4_4_ = (int)((ulong)dVar12 >> 0x20);
          _Stack_5420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_5428 = pHVar18;
          dVar12 = floor((double)pHVar18);
          local_5418.boundval = dVar12;
          pHVar18 = (HighsMipSolver *)ceil((double)local_5428);
          uVar31 = SUB84(pHVar18,0);
          uVar32 = (undefined4)((ulong)pHVar18 >> 0x20);
          pdVar8 = (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pdVar8 == (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            if (-INFINITY < pNVar29[-1].lp_objective) {
              local_5428 = pHVar18;
              std::vector<double,_std::allocator<double>_>::operator=
                        (&this->subrootsol,&(pHVar5->lpsolver).solution_.col_value);
              uVar31 = SUB84(local_5428,0);
              uVar32 = (undefined4)((ulong)local_5428 >> 0x20);
              _Var30._M_head_impl =
                   (this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            }
            pdVar8 = *(pointer *)
                      &((_Var30._M_head_impl)->rootlpsol).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
            dVar12 = uStack_5450;
            if (pdVar8 != *(pointer *)
                           ((long)&((_Var30._M_head_impl)->rootlpsol).
                                   super__Vector_base<double,_std::allocator<double>_> + 8)) {
              pHVar18 = (HighsMipSolver *)pdVar8[(long)pdVar26];
              pHVar24 = (HighsMipSolver *)local_5418.boundval;
              if ((local_5418.boundval <= (double)pHVar18) &&
                 (pHVar24 = pHVar18,
                 (double)CONCAT44(uVar32,uVar31) <= (double)pHVar18 &&
                 (double)pHVar18 != (double)CONCAT44(uVar32,uVar31))) {
                pHVar24 = (HighsMipSolver *)CONCAT44(uVar32,uVar31);
              }
              local_5460._8_8_ =
                   (double)local_5460._8_8_ *
                   (((double)pHVar24 - pNVar29[-1].branching_point) + 1.0);
              dVar12 = uStack_5450 * ((pNVar29[-1].branching_point - (double)pHVar24) + 1.0);
            }
          }
          else {
            pHVar24 = (HighsMipSolver *)pdVar8[(long)pdVar26];
            pHVar35 = (HighsMipSolver *)local_5418.boundval;
            if ((local_5418.boundval <= (double)pHVar24) &&
               (pHVar35 = pHVar24, (double)pHVar18 < (double)pHVar24)) {
              pHVar35 = pHVar18;
            }
            local_5460._8_8_ =
                 (double)local_5460._8_8_ * (((double)pHVar35 - (double)local_5428) + 1.0);
            dVar12 = uStack_5450 * (((double)local_5428 - (double)pHVar35) + 1.0);
          }
          bVar13 = (double)local_5460._8_8_ <= dVar12 + (_Var30._M_head_impl)->epsilon;
          if (bVar13) {
            pHVar20 = (HighsLpRelaxation *)local_5448;
            pHVar25 = &local_53e8;
          }
          else {
            pHVar20 = &local_53e8;
            pHVar25 = (HighsLpRelaxation *)local_5448;
            uVar31 = SUB84(local_5418.boundval,0);
            uVar32 = (undefined4)((ulong)local_5418.boundval >> 0x20);
          }
          pHVar18 = pHVar25->mipsolver;
          pNVar29[-1].branchingdecision.boundtype = (uint)!bVar13;
          pNVar29[-1].branchingdecision.boundval = (double)CONCAT44(uVar32,uVar31);
          pNVar29[-1].other_child_lb = (double)pHVar18;
          local_5460._0_8_ = pHVar20->mipsolver;
          local_5460._8_8_ = local_5460._0_8_;
          goto switchD_002e365e_default;
        case kObj:
          pHVar18 = this->mipsolver;
LAB_002e3797:
          if ((pHVar18->model_->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[(long)pdVar26] < 0.0)
          goto switchD_002e365e_caseD_1;
          break;
        case kRandom:
          uVar23 = (this->random).state;
          uVar23 = uVar23 >> 0xc ^ uVar23;
          uVar23 = uVar23 << 0x19 ^ uVar23;
          uVar23 = uVar23 >> 0x1b ^ uVar23;
          (this->random).state = uVar23;
          if (-1 < (long)(((uVar23 >> 0x20) + 0x80c8963be3e4c2f3) *
                         ((uVar23 & 0xffffffff) + 0xc8497d2a400d9551)))
          goto switchD_002e365e_caseD_1;
          break;
        case kBestCost:
          local_5460._8_8_ =
               HighsPseudocost::getPseudocostUp
                         (this->pseudocost,iVar21,(double)pHVar18,
                          ((this->mipsolver->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          feastol);
          dVar12 = HighsPseudocost::getPseudocostDown
                             (this->pseudocost,iVar21,pNVar29[-1].branching_point,
                              ((this->mipsolver->mipdata_)._M_t.
                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                              feastol);
          if (dVar12 < (double)local_5460._8_8_) {
            pNVar29[-1].branchingdecision.boundtype = kUpper;
            uVar31 = SUB84(pNVar29[-1].branching_point,0);
            uVar32 = (undefined4)((ulong)pNVar29[-1].branching_point >> 0x20);
            goto LAB_002e39fa;
          }
          pNVar29[-1].branchingdecision.boundtype = kLower;
          uVar31 = SUB84(pNVar29[-1].branching_point,0);
          uVar32 = (undefined4)((ulong)pNVar29[-1].branching_point >> 0x20);
          goto LAB_002e37ea;
        case kWorstCost:
          pHVar6 = this->pseudocost;
          local_53f0 = &pHVar6->cost_total;
          local_5460._8_8_ =
               (pHVar6->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          pdVar27 = (pHVar6->pseudocostup).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start + (long)pdVar26;
          if ((pHVar6->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(long)pdVar26] == 0) {
            pdVar27 = local_53f0;
          }
          _Stack_5420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_5428 = pHVar18;
          local_53f8 = pdVar26;
          local_5400 = (pointer)ceil((double)pHVar18);
          local_5418.boundval = ((double)local_5400 - (double)local_5428) * *pdVar27;
          pdVar27 = (pHVar6->pseudocostdown).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start + (long)pdVar26;
          if (*(int *)(local_5460._8_8_ + local_53f8 * 4) == 0) {
            pdVar27 = local_53f0;
          }
          dVar12 = floor((double)local_5428);
          uVar31 = SUB84(dVar12,0);
          uVar32 = (undefined4)((ulong)dVar12 >> 0x20);
          if (local_5418.boundval < ((double)local_5428 - dVar12) * *pdVar27) {
            pNVar29[-1].branchingdecision.boundtype = kUpper;
            goto LAB_002e39ff;
          }
          pNVar29[-1].branchingdecision.boundtype = kLower;
          uVar31 = SUB84(local_5400,0);
          uVar32 = (undefined4)((ulong)local_5400 >> 0x20);
          goto LAB_002e37ef;
        case kDisjunction:
          pHVar18 = this->mipsolver;
          _Var30._M_head_impl =
               (pHVar18->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          lVar17 = *(long *)((long)((NodeSetArray *)((long)&(_Var30._M_head_impl)->nodequeue + 0x40)
                                   )->_M_t + 0x30 + (long)pdVar26 * 0x38);
          lVar22 = *(long *)((long)((NodeSetArray *)((long)&(_Var30._M_head_impl)->nodequeue + 0x48)
                                   )->_M_t + 0x30 + (long)pdVar26 * 0x38);
          if (lVar17 <= lVar22) {
            if (lVar22 <= lVar17) goto LAB_002e3797;
            goto switchD_002e365e_caseD_1;
          }
          break;
        case kHybridInferenceCost:
          uStack_5450 = 0.0;
          local_5460._8_8_ =
               (this->pseudocost->inferencesup).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)pdVar26];
          _Stack_5420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_5428 = pHVar18;
          dVar12 = HighsPseudocost::getPseudocostUp
                             (this->pseudocost,iVar21,(double)pHVar18,
                              ((this->mipsolver->mipdata_)._M_t.
                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                              feastol);
          local_5418.column = extraout_XMM0_Dc;
          local_5418.boundval = dVar12;
          local_5418.boundtype = extraout_XMM0_Dd;
          dVar12 = (this->pseudocost->inferencesdown).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pdVar26];
          uStack_5450._0_4_ = SUB84(dVar12,0);
          uStack_5450._4_4_ = (int)((ulong)dVar12 >> 0x20);
          dVar12 = HighsPseudocost::getPseudocostDown
                             (this->pseudocost,iVar21,pNVar29[-1].branching_point,
                              ((this->mipsolver->mipdata_)._M_t.
                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                              feastol);
          auVar33._0_8_ = (double)local_5460._8_8_ + 1.0;
          auVar33._8_8_ = uStack_5450 + 1.0;
          auVar34._8_4_ = SUB84(dVar12,0);
          auVar34._0_8_ = local_5418.boundval;
          auVar34._12_4_ = (int)((ulong)dVar12 >> 0x20);
          auVar34 = divpd(auVar33,auVar34);
          bVar13 = auVar34._8_8_ <= auVar34._0_8_;
          if (bVar13) {
            dVar12 = ceil((double)local_5428);
            uVar31 = SUB84(dVar12,0);
            uVar32 = (undefined4)((ulong)dVar12 >> 0x20);
          }
          else {
            dVar12 = floor((double)local_5428);
            uVar31 = SUB84(dVar12,0);
            uVar32 = (undefined4)((ulong)dVar12 >> 0x20);
            pHVar25 = &local_53e8;
            pHVar20 = (HighsLpRelaxation *)local_5448;
          }
          pHVar18 = pHVar20->mipsolver;
          pNVar29[-1].branchingdecision.boundtype = (uint)!bVar13;
          pNVar29[-1].branchingdecision.boundval = (double)CONCAT44(uVar32,uVar31);
          pNVar29[-1].other_child_lb = (double)pHVar18;
          uVar31 = SUB84(pHVar25->mipsolver,0);
          uVar32 = (undefined4)((ulong)pHVar25->mipsolver >> 0x20);
          goto LAB_002e3a68;
        default:
          goto switchD_002e365e_default;
        }
        pNVar29[-1].branchingdecision.boundtype = kLower;
LAB_002e37ea:
        dVar12 = ceil((double)CONCAT44(uVar32,uVar31));
        uVar31 = SUB84(dVar12,0);
        uVar32 = (undefined4)((ulong)dVar12 >> 0x20);
LAB_002e37ef:
        pNVar29[-1].branchingdecision.boundval = (double)CONCAT44(uVar32,uVar31);
        pNVar29[-1].other_child_lb = (double)local_53e8.mipsolver;
        uVar31 = (undefined4)local_5448._0_8_;
        uVar32 = SUB84(local_5448._0_8_,4);
LAB_002e3a68:
        local_5460._8_8_ = CONCAT44(uVar32,uVar31);
        local_5460._0_8_ = CONCAT44(uVar32,uVar31);
switchD_002e365e_default:
        pNVar29 = (this->nodestack).
                  super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        break;
      }
      NVar15 = evaluateNode(this);
      if (NVar15 == kSubOptimal) {
        NVar15 = kSubOptimal;
        goto switchD_002e365e_default;
      }
      pNVar29 = (this->nodestack).
                super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (pNVar29[-1].opensubtrees == '\x02');
  }
  this->inbranching = false;
  pHVar6 = this->pseudocost;
  pHVar6->minreliable = iVar4;
  pHVar6->degeneracyFactor = 1.0;
  if (NVar15 == kSubOptimal) {
    return kSubOptimal;
  }
  if (pNVar29[-1].opensubtrees != '\x02') {
    return NVar15;
  }
  if (pNVar29[-1].branchingdecision.column == -1) {
    pHVar6->degeneracyFactor = 1000000.0;
    _Var30._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    piVar28 = *(int **)&((_Var30._M_head_impl)->integral_cols).
                        super__Vector_base<int,_std::allocator<int>_>;
    piVar11 = *(pointer *)((long)&(_Var30._M_head_impl)->integral_cols + 8);
    if (piVar28 == piVar11) {
      pHVar6->degeneracyFactor = 1.0;
    }
    else {
      local_5418.boundval = (double)&this->localdom;
      local_5460._8_8_ = (HighsMipSolver *)0xbff0000000000000;
      do {
        frac = 0.5;
        iVar4 = *piVar28;
        dVar12 = (this->localdom).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar4];
        dVar1 = (this->localdom).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar4];
        if (0.5 <= dVar12 - dVar1) {
          if (dVar1 <= -INFINITY) {
            if (dVar12 < INFINITY) {
              frac = dVar12 + -0.5;
            }
          }
          else {
            frac = dVar1 + 0.5;
          }
          pHVar18 = (HighsMipSolver *)HighsPseudocost::getScore(this->pseudocost,iVar4,frac);
          if ((double)local_5460._8_8_ < (double)pHVar18) {
            if ((this->lp->status - kOptimal & 0xfffffffd) == 0) {
              pvVar19 = &(this->lp->lpsolver).solution_.col_dual;
              pHVar24 = this->mipsolver;
            }
            else {
              pHVar24 = this->mipsolver;
              pvVar19 = &pHVar24->model_->col_cost_;
            }
            dVar12 = (pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar4];
            _Var30._M_head_impl =
                 (pHVar24->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            dVar1 = (_Var30._M_head_impl)->feastol;
            local_5428 = pHVar18;
            if (ABS(dVar12) <= dVar1) {
LAB_002e3d13:
              dVar12 = (this->pseudocost->inferencesup).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar4];
              dVar2 = (this->pseudocost->inferencesdown).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar4];
              if (dVar1 + dVar2 < dVar12) goto LAB_002e3d3c;
              if (dVar2 - dVar1 <= dVar12) {
                dVar12 = local_5418.boundval;
                HighsDomain::getColLowerPos
                          ((HighsDomain *)local_5418.boundval,iVar4,
                           (HighsInt)
                           ((ulong)((long)(this->localdom).domchgstack_.
                                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->localdom).domchgstack_.
                                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4),
                           (HighsInt *)&local_53e8);
                HighsDomain::getColUpperPos
                          ((HighsDomain *)dVar12,iVar4,
                           (HighsInt)
                           ((ulong)((long)(this->localdom).domchgstack_.
                                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->localdom).domchgstack_.
                                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4),
                           (HighsInt *)local_5448);
                if ((int)local_53e8.mipsolver <= (int)local_5448._0_4_) goto LAB_002e3d3c;
              }
LAB_002e3d9f:
              dVar12 = floor(frac);
              uVar31 = SUB84(dVar12,0);
              uVar32 = (undefined4)((ulong)dVar12 >> 0x20);
              HVar16 = kUpper;
            }
            else {
              dVar2 = this->upper_limit;
              uVar31 = SUB84(dVar2,0);
              uVar32 = (undefined4)((ulong)dVar2 >> 0x20);
              dVar3 = (_Var30._M_head_impl)->upper_limit;
              if (dVar3 <= dVar2) {
                uVar31 = SUB84(dVar3,0);
                uVar32 = (undefined4)((ulong)dVar3 >> 0x20);
              }
              if ((double)CONCAT44(uVar32,uVar31) == INFINITY) goto LAB_002e3d13;
              if (dVar12 <= 0.0) goto LAB_002e3d9f;
LAB_002e3d3c:
              dVar12 = ceil(frac);
              uVar31 = SUB84(dVar12,0);
              uVar32 = (undefined4)((ulong)dVar12 >> 0x20);
              HVar16 = kLower;
            }
            pNVar29[-1].branching_point = (double)CONCAT44(uVar32,uVar31);
            pNVar29[-1].branchingdecision.boundtype = HVar16;
            pNVar29[-1].branchingdecision.column = iVar4;
            pNVar29[-1].branchingdecision.boundval = (double)CONCAT44(uVar32,uVar31);
            local_5460._8_8_ = local_5428;
          }
        }
        piVar28 = piVar28 + 1;
      } while (piVar28 != piVar11);
      iVar4 = pNVar29[-1].branchingdecision.column;
      this->pseudocost->degeneracyFactor = 1.0;
      if (iVar4 != -1) {
        local_5460._8_8_ = local_5460._0_8_;
        goto LAB_002e3ac3;
      }
    }
    if (this->lp->status == kOptimal) {
      pNVar29[-1].opensubtrees = '\0';
      NVar15 = kLpInfeasible;
    }
    else {
      HighsLpRelaxation::setIterationLimit(this->lp,0x7fffffff);
      HighsLpRelaxation::HighsLpRelaxation(&local_53e8,this->mipsolver);
      HighsLpRelaxation::loadModel(&local_53e8);
      Highs::changeColsBounds
                (&local_53e8.lpsolver,0,this->mipsolver->model_->num_col_ + -1,
                 (this->localdom).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (this->localdom).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      pHVar25 = this->lp;
      this->lp = &local_53e8;
      pHVar18 = (HighsMipSolver *)(local_5448 + 0x10);
      local_5448._0_8_ = pHVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5448,"presolve","");
      Highs::setOptionValue(&local_53e8.lpsolver,(string *)local_5448,&::kHighsOnString_abi_cxx11_);
      if ((HighsMipSolver *)local_5448._0_8_ != pHVar18) {
        operator_delete((void *)local_5448._0_8_);
      }
      NVar15 = evaluateNode(this);
      if (NVar15 == kOpen) {
        Highs::clearSolver(&this->lp->lpsolver);
        pHVar20 = this->lp;
        local_5448._0_8_ = pHVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5448,"simplex_strategy","");
        Highs::setOptionValue(&pHVar20->lpsolver,(string *)local_5448,4);
        if ((HighsMipSolver *)local_5448._0_8_ != pHVar18) {
          operator_delete((void *)local_5448._0_8_);
        }
        NVar15 = evaluateNode(this);
        pHVar20 = this->lp;
        local_5448._0_8_ = pHVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5448,"simplex_strategy","");
        Highs::setOptionValue(&pHVar20->lpsolver,(string *)local_5448,1);
        if ((HighsMipSolver *)local_5448._0_8_ != pHVar18) {
          operator_delete((void *)local_5448._0_8_);
        }
        if (NVar15 == kOpen) {
          Highs::clearSolver(&this->lp->lpsolver);
          pHVar20 = this->lp;
          local_5448._0_8_ = pHVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5448,"solver","");
          Highs::setOptionValue(&pHVar20->lpsolver,(string *)local_5448,"ipm");
          if ((HighsMipSolver *)local_5448._0_8_ != pHVar18) {
            operator_delete((void *)local_5448._0_8_);
          }
          NVar15 = evaluateNode(this);
          if (NVar15 == kOpen) {
            highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,
                         kWarning,
                         "Failed to solve node with all integer columns fixed. Declaring node infeasible.\n"
                        );
            pNVar29[-1].opensubtrees = '\0';
            NVar15 = kLpInfeasible;
          }
        }
      }
      this->lp = pHVar25;
      HighsLpRelaxation::~HighsLpRelaxation(&local_53e8);
    }
  }
  else {
LAB_002e3ac3:
    pHVar9 = (this->localdom).domchgstack_.
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pHVar10 = (this->localdom).domchgstack_.
              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar13 = orbitsValidInChildNode(this,&pNVar29[-1].branchingdecision);
    HighsDomain::changeBound(&this->localdom,pNVar29[-1].branchingdecision,(Reason)0xffffffff);
    pNVar29[-1].opensubtrees = '\x01';
    __args = (pointer)local_5460;
    if ((double)local_5460._8_8_ < pNVar29[-1].lower_bound) {
      __args = pNVar29 + -1;
    }
    if (bVar13) {
      local_53e8.mipsolver =
           (HighsMipSolver *)
           pNVar29[-1].stabilizerOrbits.
           super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_53e8.lpsolver._vptr_Highs =
           (_func_int **)
           pNVar29[-1].stabilizerOrbits.
           super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_53e8.lpsolver._vptr_Highs)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_53e8.lpsolver._vptr_Highs)->_M_use_count + 1;
        }
      }
    }
    else {
      local_53e8.mipsolver = (HighsMipSolver *)0x0;
      local_53e8.lpsolver._vptr_Highs = (_func_int **)0x0;
    }
    std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
    emplace_back<double_const&,double&,std::shared_ptr<HighsBasis_const>&,std::shared_ptr<StabilizerOrbits_const>>
              ((vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *)
               &this->nodestack,&__args->lower_bound,&pNVar29[-1].estimate,&pNVar29[-1].nodeBasis,
               (shared_ptr<const_StabilizerOrbits> *)&local_53e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs);
    }
    (this->nodestack).
    super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].domgchgStackPos =
         (HighsInt)((ulong)((long)pHVar9 - (long)pHVar10) >> 4);
    NVar15 = kBranched;
  }
  return NVar15;
}

Assistant:

HighsSearch::NodeResult HighsSearch::branch() {
  assert(localdom.getChangedCols().empty());

  assert(nodestack.back().opensubtrees == 2);
  nodestack.back().branchingdecision.column = -1;
  inbranching = true;

  HighsInt minrel = pseudocost.getMinReliable();
  double childLb = getCurrentLowerBound();
  NodeResult result = NodeResult::kOpen;
  while (nodestack.back().opensubtrees == 2 &&
         lp->scaledOptimal(lp->getStatus()) &&
         !lp->getFractionalIntegers().empty()) {
    int64_t sbmaxiters = 0;
    if (minrel > 0) {
      int64_t sbiters = getStrongBranchingLpIterations();
      sbmaxiters =
          100000 + ((getTotalLpIterations() - getHeuristicLpIterations() -
                     getStrongBranchingLpIterations()) >>
                    1);
      if (sbiters > sbmaxiters) {
        pseudocost.setMinReliable(0);
      } else if (sbiters > (sbmaxiters >> 1)) {
        double reductionratio = (sbiters - (sbmaxiters >> 1)) /
                                (double)(sbmaxiters - (sbmaxiters >> 1));

        HighsInt minrelreduced = int(minrel - reductionratio * (minrel - 1));
        pseudocost.setMinReliable(std::min(minrel, minrelreduced));
      }
    }

    double degeneracyFac = lp->computeLPDegneracy(localdom);
    pseudocost.setDegeneracyFactor(degeneracyFac);
    if (degeneracyFac >= 10.0) pseudocost.setMinReliable(0);
    // if (!mipsolver.submip)
    //  printf("selecting branching cand with minrel=%d\n",
    //         pseudocost.getMinReliable());
    double downNodeLb = getCurrentLowerBound();
    double upNodeLb = getCurrentLowerBound();
    HighsInt branchcand =
        selectBranchingCandidate(sbmaxiters, downNodeLb, upNodeLb);
    // if (!mipsolver.submip)
    //   printf("branching cand returned as %d\n", branchcand);
    NodeData& currnode = nodestack.back();
    childLb = currnode.lower_bound;
    if (branchcand != -1) {
      auto branching = lp->getFractionalIntegers()[branchcand];
      currnode.branchingdecision.column = branching.first;
      currnode.branching_point = branching.second;

      HighsInt col = branching.first;

      switch (childselrule) {
        case ChildSelectionRule::kUp:
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.boundval =
              std::ceil(currnode.branching_point);
          currnode.other_child_lb = downNodeLb;
          childLb = upNodeLb;
          break;
        case ChildSelectionRule::kDown:
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.boundval =
              std::floor(currnode.branching_point);
          currnode.other_child_lb = upNodeLb;
          childLb = downNodeLb;
          break;
        case ChildSelectionRule::kRootSol: {
          double downPrio = pseudocost.getAvgInferencesDown(col) +
                            mipsolver.mipdata_->epsilon;
          double upPrio =
              pseudocost.getAvgInferencesUp(col) + mipsolver.mipdata_->epsilon;
          double downVal = std::floor(currnode.branching_point);
          double upVal = std::ceil(currnode.branching_point);
          if (!subrootsol.empty()) {
            double rootsol = subrootsol[col];
            if (rootsol < downVal)
              rootsol = downVal;
            else if (rootsol > upVal)
              rootsol = upVal;

            upPrio *= (1.0 + (currnode.branching_point - rootsol));
            downPrio *= (1.0 + (rootsol - currnode.branching_point));

          } else {
            if (currnode.lp_objective != -kHighsInf)
              subrootsol = lp->getSolution().col_value;
            if (!mipsolver.mipdata_->rootlpsol.empty()) {
              double rootsol = mipsolver.mipdata_->rootlpsol[col];
              if (rootsol < downVal)
                rootsol = downVal;
              else if (rootsol > upVal)
                rootsol = upVal;

              upPrio *= (1.0 + (currnode.branching_point - rootsol));
              downPrio *= (1.0 + (rootsol - currnode.branching_point));
            }
          }
          if (upPrio + mipsolver.mipdata_->epsilon >= downPrio) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kObj:
          if (mipsolver.colCost(col) >= 0) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kRandom:
          if (random.bit()) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kBestCost: {
          if (pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol) >
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kWorstCost:
          if (pseudocost.getPseudocostUp(col, currnode.branching_point) >=
              pseudocost.getPseudocostDown(col, currnode.branching_point)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kDisjunction: {
          int64_t numnodesup;
          int64_t numnodesdown;
          numnodesup = mipsolver.mipdata_->nodequeue.numNodesUp(col);
          numnodesdown = mipsolver.mipdata_->nodequeue.numNodesDown(col);
          if (numnodesup > numnodesdown) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else if (numnodesdown > numnodesup) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            if (mipsolver.colCost(col) >= 0) {
              currnode.branchingdecision.boundtype = HighsBoundType::kLower;
              currnode.branchingdecision.boundval =
                  std::ceil(currnode.branching_point);
              currnode.other_child_lb = downNodeLb;
              childLb = upNodeLb;
            } else {
              currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
              currnode.branchingdecision.boundval =
                  std::floor(currnode.branching_point);
              currnode.other_child_lb = upNodeLb;
              childLb = downNodeLb;
            }
          }
          break;
        }
        case ChildSelectionRule::kHybridInferenceCost: {
          double upVal = std::ceil(currnode.branching_point);
          double downVal = std::floor(currnode.branching_point);
          double upScore =
              (1 + pseudocost.getAvgInferencesUp(col)) /
              pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol);
          double downScore =
              (1 + pseudocost.getAvgInferencesDown(col)) /
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol);

          if (upScore >= downScore) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
        }
      }
      result = NodeResult::kBranched;
      break;
    }

    assert(!localdom.getChangedCols().empty());
    result = evaluateNode();
    if (result == NodeResult::kSubOptimal) break;
  }
  inbranching = false;
  NodeData& currnode = nodestack.back();
  pseudocost.setMinReliable(minrel);
  pseudocost.setDegeneracyFactor(1.0);

  assert(currnode.opensubtrees == 2 || currnode.opensubtrees == 0);

  if (currnode.opensubtrees != 2 || result == NodeResult::kSubOptimal)
    return result;

  if (currnode.branchingdecision.column == -1) {
    double bestscore = -1.0;
    // solution branching failed, so choose any integer variable to branch
    // on in case we have a different solution status could happen due to a
    // fail in the LP solution process
    pseudocost.setDegeneracyFactor(1e6);

    for (HighsInt i : mipsolver.mipdata_->integral_cols) {
      if (localdom.col_upper_[i] - localdom.col_lower_[i] < 0.5) continue;

      double fracval;
      if (localdom.col_lower_[i] != -kHighsInf &&
          localdom.col_upper_[i] != kHighsInf)
        fracval = std::floor(0.5 * (localdom.col_lower_[i] +
                                    localdom.col_upper_[i] + 0.5)) +
                  0.5;
      if (localdom.col_lower_[i] != -kHighsInf)
        fracval = localdom.col_lower_[i] + 0.5;
      else if (localdom.col_upper_[i] != kHighsInf)
        fracval = localdom.col_upper_[i] - 0.5;
      else
        fracval = 0.5;

      double score = pseudocost.getScore(i, fracval);
      assert(score >= 0.0);

      if (score > bestscore) {
        bestscore = score;
        bool branchUpwards;
        double cost = lp->unscaledDualFeasible(lp->getStatus())
                          ? lp->getSolution().col_dual[i]
                          : mipsolver.colCost(i);
        if (std::fabs(cost) > mipsolver.mipdata_->feastol &&
            getCutoffBound() < kHighsInf) {
          // branch in direction of worsening cost first in case the column has
          // cost and we do have an upper bound
          branchUpwards = cost > 0;
        } else if (pseudocost.getAvgInferencesUp(i) >
                   pseudocost.getAvgInferencesDown(i) +
                       mipsolver.mipdata_->feastol) {
          // column does not have (reduced) cost above tolerance so branch in
          // direction of more inferences
          branchUpwards = true;
        } else if (pseudocost.getAvgInferencesUp(i) <
                   pseudocost.getAvgInferencesDown(i) -
                       mipsolver.mipdata_->feastol) {
          branchUpwards = false;
        } else {
          // number of inferences give a tie, so we branch in the direction that
          // does have a less recent domain change to avoid branching the same
          // integer column into the same direction over and over
          HighsInt colLowerPos;
          HighsInt colUpperPos;
          localdom.getColLowerPos(i, localdom.getNumDomainChanges(),
                                  colLowerPos);
          localdom.getColUpperPos(i, localdom.getNumDomainChanges(),
                                  colUpperPos);
          branchUpwards = colLowerPos <= colUpperPos;
        }
        if (branchUpwards) {
          double upval = std::ceil(fracval);
          currnode.branching_point = upval;
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = upval;
        } else {
          double downval = std::floor(fracval);
          currnode.branching_point = downval;
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = downval;
        }
      }
    }

    pseudocost.setDegeneracyFactor(1);
  }

  if (currnode.branchingdecision.column == -1) {
    if (lp->getStatus() == HighsLpRelaxation::Status::kOptimal) {
      // if the LP was solved to optimality and all columns are fixed, then this
      // particular assignment is not feasible or has a worse objective in the
      // original space, otherwise the node would not be open. Hence we prune
      // this particular assignment
      currnode.opensubtrees = 0;
      result = NodeResult::kLpInfeasible;
      return result;
    }
    lp->setIterationLimit();

    // create a fresh LP only with model rows since all integer columns are
    // fixed, the cutting planes are not required and the LP could not be solved
    // so we want to make it as easy as possible
    HighsLpRelaxation lpCopy(mipsolver);
    lpCopy.loadModel();
    lpCopy.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                          localdom.col_lower_.data(),
                                          localdom.col_upper_.data());
    // temporarily use the fresh LP for the HighsSearch class
    HighsLpRelaxation* tmpLp = &lpCopy;
    std::swap(tmpLp, lp);

    // reevaluate the node with LP presolve enabled
    lp->getLpSolver().setOptionValue("presolve", kHighsOnString);
    result = evaluateNode();

    if (result == NodeResult::kOpen) {
      // LP still not solved, reevaluate with primal simplex
      lp->getLpSolver().clearSolver();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyPrimal);
      result = evaluateNode();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyDual);
      if (result == NodeResult::kOpen) {
        // LP still not solved, reevaluate with IPM instead of simplex
        lp->getLpSolver().clearSolver();
        lp->getLpSolver().setOptionValue("solver", "ipm");
        result = evaluateNode();

        if (result == NodeResult::kOpen) {
          highsLogUser(mipsolver.options_mip_->log_options,
                       HighsLogType::kWarning,
                       "Failed to solve node with all integer columns "
                       "fixed. Declaring node infeasible.\n");
          // LP still not solved, give up and declare as infeasible
          currnode.opensubtrees = 0;
          result = NodeResult::kLpInfeasible;
        }
      }
    }

    // restore old lp relaxation
    std::swap(tmpLp, lp);

    return result;
  }

  // finally open a new node with the branching decision added
  // and remember that we have one open subtree left
  HighsInt domchgPos = localdom.getDomainChangeStack().size();

  bool passStabilizerToChildNode =
      orbitsValidInChildNode(currnode.branchingdecision);
  localdom.changeBound(currnode.branchingdecision);
  currnode.opensubtrees = 1;
  nodestack.emplace_back(
      std::max(childLb, currnode.lower_bound), currnode.estimate,
      currnode.nodeBasis,
      passStabilizerToChildNode ? currnode.stabilizerOrbits : nullptr);
  nodestack.back().domgchgStackPos = domchgPos;

  return NodeResult::kBranched;
}